

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O2

void __thiscall Intel_V4L2::Intel_V4L2(Intel_V4L2 *this)

{
  CameraBase::CameraBase(&this->super_CameraBase);
  (this->super_CameraBase)._vptr_CameraBase = (_func_int **)&PTR__Intel_V4L2_00104d48;
  this->m_fd = -1;
  this->m_pBigBuffer = (uchar *)0x0;
  this->m_pV4l2Buffer = (v4l2_buffer *)0x0;
  this->m_frameCount = 0;
  this->m_bigBufferLength = 0;
  init_device(this);
  return;
}

Assistant:

Intel_V4L2::Intel_V4L2 () 
    : CameraBase ()
{
    m_bigBufferLength = 0;
    m_frameCount      = 0;
    m_fd              = -1;
    m_pBigBuffer      = NULL;
    m_pV4l2Buffer     = 0;
    init_device ();
}